

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O0

bool __thiscall QHttpNetworkRequest::methodIsIdempotent(QHttpNetworkRequest *this)

{
  bool bVar1;
  const_iterator pvVar2;
  Operation *in_RDI;
  long in_FS_OFFSET;
  array<QHttpNetworkRequest::Operation,_5UL> knownSafe;
  Operation *__last;
  anon_class_4_1_3ccad3da_for__M_pred __pred;
  Operation local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0] = Get;
  local_28[1] = Head;
  local_28[2] = Put;
  local_28[3] = Trace;
  local_28[4] = 0;
  __last = local_28;
  pvVar2 = std::array<QHttpNetworkRequest::Operation,_5UL>::begin
                     ((array<QHttpNetworkRequest::Operation,_5UL> *)0x30a8c7);
  __pred.currentOp = (Operation)((ulong)pvVar2 >> 0x20);
  std::array<QHttpNetworkRequest::Operation,_5UL>::end
            ((array<QHttpNetworkRequest::Operation,_5UL> *)0x30a8d5);
  QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->
            ((QSharedDataPointer<QHttpNetworkRequestPrivate> *)0x30a8e8);
  bVar1 = std::
          any_of<QHttpNetworkRequest::Operation_const*,QHttpNetworkRequest::methodIsIdempotent()const::__0>
                    (in_RDI,__last,__pred);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpNetworkRequest::methodIsIdempotent() const
{
    using Op = Operation;
    constexpr auto knownSafe = std::array{ Op::Get, Op::Head, Op::Put, Op::Trace, Op::Options };
    return std::any_of(knownSafe.begin(), knownSafe.end(),
                       [currentOp = d->operation](auto op) { return op == currentOp; });
}